

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_all.cc
# Opt level: O3

EC_KEY * pkey_get_eckey(EVP_PKEY *key,EC_KEY **eckey)

{
  EC_KEY *pEVar1;
  
  if (key != (EVP_PKEY *)0x0) {
    pEVar1 = (EC_KEY *)EVP_PKEY_get1_EC_KEY((EVP_PKEY *)key);
    EVP_PKEY_free((EVP_PKEY *)key);
    if (pEVar1 != (EC_KEY *)0x0) {
      if (eckey == (EC_KEY **)0x0) {
        return pEVar1;
      }
      EC_KEY_free((EC_KEY *)*eckey);
      *eckey = pEVar1;
      return pEVar1;
    }
  }
  return (EC_KEY *)0x0;
}

Assistant:

static EC_KEY *pkey_get_eckey(EVP_PKEY *key, EC_KEY **eckey) {
  EC_KEY *dtmp;
  if (!key) {
    return NULL;
  }
  dtmp = EVP_PKEY_get1_EC_KEY(key);
  EVP_PKEY_free(key);
  if (!dtmp) {
    return NULL;
  }
  if (eckey) {
    EC_KEY_free(*eckey);
    *eckey = dtmp;
  }
  return dtmp;
}